

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O3

void test_z5_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
               (Zp_field_operators<unsigned_int,_void> *op)

{
  pointer *ppuVar1;
  Zp_field_operators<unsigned_int,_void> *pZVar2;
  ulong uVar3;
  Zp_field_operators<unsigned_int,_void> local_238;
  undefined1 local_218;
  undefined8 *local_210;
  pointer *local_208;
  undefined **local_200;
  ulong local_1f8;
  shared_count sStack_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1e8;
  undefined1 local_1e0 [8];
  undefined8 local_1d8;
  shared_count sStack_1d0;
  undefined **local_1c8;
  char *local_1c0;
  undefined8 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  Zp_field_operators<unsigned_int,_void> *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x149);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  uVar3 = 7;
  if (op->characteristic_ < 8) {
    uVar3 = (ulong)(byte)(7 % (byte)op->characteristic_);
  }
  local_238.characteristic_ =
       (op->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar3];
  local_1e0[0] = local_238.characteristic_ == 3;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_238._4_4_ = 3;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  ppuVar1 = (pointer *)
            ((long)&local_238.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x149,1,2,2,"op.get_inverse(z51)",ppuVar1,"3",
             &local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x14a);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  uVar3 = 3;
  if (op->characteristic_ < 4) {
    uVar3 = (ulong)(byte)(3 % (byte)op->characteristic_);
  }
  local_238.characteristic_ =
       (op->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar3];
  local_238._4_4_ = 2;
  local_1e0[0] = local_238.characteristic_ == 2;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x14a,1,2,2,"op.get_inverse(z52)",ppuVar1,"2",
             &local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x14b);
  uVar3 = 7;
  if (op->characteristic_ < 8) {
    uVar3 = (ulong)(byte)(7 % (byte)op->characteristic_);
  }
  local_1f8 = 0;
  sStack_1f0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = (undefined **)0x11a954;
  local_1c0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d60;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_98 = "";
  local_208 = (pointer *)&local_1c8;
  local_200._0_1_ =
       (op->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar3] == 3;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f0);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x14c);
  uVar3 = 3;
  if (op->characteristic_ < 4) {
    uVar3 = (ulong)(byte)(3 % (byte)op->characteristic_);
  }
  local_200 = (undefined **)
              CONCAT71(local_200._1_7_,
                       (op->inverse_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3] == 2);
  local_1f8 = 0;
  sStack_1f0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = (undefined **)0x11a98f;
  local_1c0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d60;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_c8 = "";
  local_208 = (pointer *)&local_1c8;
  local_198 = op;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f0);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x14e);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_238.characteristic_ = 0;
  local_238._4_4_ = 0;
  local_218 = 0;
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_1e0[0] = 1;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x150);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_238.characteristic_ = 1;
  local_238._4_4_ = 1;
  local_1e0[0] = 1;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x150,1,2,2,"op.get_multiplicative_identity()",
             (pointer *)
             ((long)&local_238.inverse_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 0x10),"1",&local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x151);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_238.characteristic_ = 1;
  local_238._4_4_ = 1;
  local_1e0[0] = 1;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x151,1,2,2,
             "op.get_partial_multiplicative_identity(35)",
             (pointer *)
             ((long)&local_238.inverse_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 0x10),"1",&local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x153);
  pZVar2 = local_198;
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_238.characteristic_ = 5;
  local_1e0[0] = local_198->characteristic_ == 5;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_198->characteristic_;
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x153,1,2,2,"op.get_characteristic()",
             (pointer *)
             ((long)&local_238.inverse_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 0x10),"5",&local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x155);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_238.characteristic_ = 7;
  if (pZVar2->characteristic_ < 8) {
    local_238.characteristic_ = (Characteristic)(byte)(7 % (byte)pZVar2->characteristic_);
  }
  local_238._4_4_ = 2;
  local_1e0[0] = local_238.characteristic_ == 2;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x155,1,2,2,"op.get_value(z51)",
             (pointer *)
             ((long)&local_238.inverse_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 0x10),"2",&local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x156);
  local_1c0 = (char *)((ulong)local_1c0 & 0xffffffffffffff00);
  local_1c8 = &PTR__lazy_ostream_00120ce0;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_238.characteristic_ = 3;
  if (local_198->characteristic_ < 4) {
    local_238.characteristic_ = (Characteristic)(byte)(3 % (byte)local_198->characteristic_);
  }
  local_238._4_4_ = 3;
  local_1e0[0] = local_238.characteristic_ == 3;
  local_1d8 = 0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a0 = "";
  local_218 = 0;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__lazy_ostream_00120d20;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (pointer *)
              ((long)&local_238.inverse_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_00120ca0;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_238.inverse_;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_238.field_0x4;
  local_238.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = &local_238.characteristic_;
  boost::test_tools::tt_detail::report_assertion
            (local_1e0,&local_1c8,&local_1a8,0x156,1,2,2,"op.get_value(z52)",
             (pointer *)
             ((long)&local_238.inverse_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 0x10),"3",&local_200);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  return;
}

Assistant:

void test_z5_standart_field_properties(Z5& op) {
  unsigned int z51 = 7;
  unsigned int z52 = 3;

  BOOST_CHECK_EQUAL(op.get_inverse(z51), 3);
  BOOST_CHECK_EQUAL(op.get_inverse(z52), 2);
  BOOST_CHECK(op.get_partial_inverse(z51, 35) == std::make_pair(3u, 35u));
  BOOST_CHECK(op.get_partial_inverse(z52, 35) == std::make_pair(2u, 35u));

  BOOST_CHECK_EQUAL(op.get_additive_identity(), 0);

  BOOST_CHECK_EQUAL(op.get_multiplicative_identity(), 1);
  BOOST_CHECK_EQUAL(op.get_partial_multiplicative_identity(35), 1);

  BOOST_CHECK_EQUAL(op.get_characteristic(), 5);

  BOOST_CHECK_EQUAL(op.get_value(z51), 2);
  BOOST_CHECK_EQUAL(op.get_value(z52), 3);
}